

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<std::complex<float>_>::AddKel
          (TPZSkylMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *elmat,
          TPZVec<long> *source,TPZVec<long> *destination)

{
  _ComplexT _Var1;
  _ComplexT _Var2;
  long lVar3;
  long lVar4;
  long lVar5;
  complex<float> *pcVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  lVar3 = source->fNElements;
  if (0 < lVar3) {
    lVar9 = 0;
    do {
      lVar4 = destination->fStore[lVar9];
      lVar5 = source->fStore[lVar9];
      lVar8 = lVar9;
      do {
        lVar11 = destination->fStore[lVar8];
        lVar7 = -(lVar4 - lVar11);
        lVar10 = lVar4 - lVar11;
        if (lVar10 != 0 && lVar11 <= lVar4) {
          lVar11 = lVar4;
          lVar7 = lVar10;
        }
        lVar10 = source->fStore[lVar8];
        if ((((lVar5 < 0) ||
             ((elmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar5)) ||
            (lVar10 < 0)) ||
           ((elmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar10)) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar6 = (this->fElem).fStore[lVar11];
        _Var1 = elmat->fElem
                [lVar10 * (elmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow +
                 lVar5]._M_value;
        _Var2 = pcVar6[lVar7]._M_value;
        pcVar6[lVar7]._M_value =
             CONCAT44((float)(_Var2 >> 0x20) + (float)(_Var1 >> 0x20),(float)_Var2 + (float)_Var1);
        lVar8 = lVar8 + 1;
      } while (lVar8 < lVar3);
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar3);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::AddKel(TPZFMatrix<TVar>&elmat,
                                 TPZVec<int64_t> &source,
                                 TPZVec<int64_t> &destination)
{
    int64_t nelem = source.NElements();
    int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    for(icoef=0; icoef<nelem; icoef++) {
        ieq = destination[icoef];
        ieqs = source[icoef];
        for(jcoef=icoef; jcoef<nelem; jcoef++) {
            jeq = destination[jcoef];
            jeqs = source[jcoef];
            int64_t row(ieq), col(jeq);
            // invertendo linha-coluna para triangular superior
            if (row > col)
                this->Swap(&row, &col);
#ifdef PZDEBUG
            // checando limites
            if(row >= this->Dim() || col >= this->Dim()) {
                cout << "TPZSkylMatrix::GetVal index out of range row = " <<
                row << " col = " << col << endl;
                DebugStop();
            }
#endif
            // indice do vetor coluna
            int64_t index = col - row;
#ifdef PZDEBUG
            // checando limite da coluna
            if (index >= Size(col)) {
                cerr << "Try TPZSkylMatrix gZero." << endl;
                DebugStop();
            }
#endif
            // executando contribuição
            fElem[col][index] += elmat(ieqs,jeqs);

        }
    }
}